

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O2

void __thiscall Timidity::Renderer::HandleEvent(Renderer *this,int status,int parm1,int parm2)

{
  uint uVar1;
  uint chan;
  
  uVar1 = (status & 0xf0U) - 0x80 >> 4;
  if (uVar1 < 7) {
    chan = status & 0xf;
    switch(uVar1) {
    case 0:
      note_off(this,chan,parm1,parm2);
      return;
    case 1:
      note_on(this,chan,parm1,parm2);
      return;
    case 2:
      adjust_pressure(this,chan,parm1,parm2);
      return;
    case 3:
      HandleController(this,chan,parm1,parm2);
      return;
    case 4:
      if (((uint)this->drumchannels >> chan & 1) != 0) {
        this->channel[chan].bank = parm1;
        return;
      }
      this->channel[chan].program = parm1;
      break;
    case 6:
      this->channel[chan].pitchbend = parm2 << 7 | parm1;
      this->channel[chan].pitchfactor = 0.0;
      adjust_pitchbend(this,chan);
      return;
    }
  }
  return;
}

Assistant:

void Renderer::HandleEvent(int status, int parm1, int parm2)
{
	int command = status & 0xF0;
	int chan	= status & 0x0F;

	switch (command)
	{
	case ME_NOTEON:
		note_on(chan, parm1, parm2);
		break;

	case ME_NOTEOFF:
		note_off(chan, parm1, parm2);
		break;

	case ME_KEYPRESSURE:
		adjust_pressure(chan, parm1, parm2);
		break;

	case ME_CONTROLCHANGE:
		HandleController(chan, parm1, parm2);
		break;

	case ME_PROGRAM:
		if (ISDRUMCHANNEL(chan))
		{
			/* Change drum set */
			channel[chan].bank = parm1;
		}
		else
		{
			channel[chan].program = parm1;
		}
		break;

	case ME_CHANNELPRESSURE:
		/* Unimplemented */
		break;

	case ME_PITCHWHEEL:
		channel[chan].pitchbend = parm1 | (parm2 << 7);
		channel[chan].pitchfactor = 0;
		/* Adjust for notes already playing */
		adjust_pitchbend(chan);
		break;
	}
}